

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O0

level_enum spdlog::level::from_str(string *name)

{
  bool bVar1;
  basic_string_view<char> *pbVar2;
  basic_string_view<char> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string_view<char> *it;
  undefined1 *__val;
  basic_string_view<char> *in_stack_ffffffffffffffe0;
  level_enum local_4;
  
  __val = level_string_views;
  pbVar2 = std::begin<fmt::v8::basic_string_view<char>const,7ul>
                     ((basic_string_view<char> (*) [7])level_string_views);
  std::end<fmt::v8::basic_string_view<char>const,7ul>((basic_string_view<char> (*) [7])__val);
  pbVar2 = std::find<fmt::v8::basic_string_view<char>const*,std::__cxx11::string>
                     (in_stack_ffffffffffffffe0,pbVar2,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__val);
  pbVar3 = std::end<fmt::v8::basic_string_view<char>const,7ul>
                     ((basic_string_view<char> (*) [7])level_string_views);
  if (pbVar2 == pbVar3) {
    bVar1 = std::operator==(in_RDI,"warn");
    if (bVar1) {
      local_4 = warn;
    }
    else {
      bVar1 = std::operator==(in_RDI,"err");
      if (bVar1) {
        local_4 = err;
      }
      else {
        local_4 = off;
      }
    }
  }
  else {
    pbVar3 = std::begin<fmt::v8::basic_string_view<char>const,7ul>
                       ((basic_string_view<char> (*) [7])level_string_views);
    local_4 = (level_enum)((long)pbVar2 - (long)pbVar3 >> 4);
  }
  return local_4;
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum from_str(const std::string &name) SPDLOG_NOEXCEPT
{
    auto it = std::find(std::begin(level_string_views), std::end(level_string_views), name);
    if (it != std::end(level_string_views))
        return static_cast<level::level_enum>(it - std::begin(level_string_views));

    // check also for "warn" and "err" before giving up..
    if (name == "warn")
    {
        return level::warn;
    }
    if (name == "err")
    {
        return level::err;
    }
    return level::off;
}